

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O2

void __thiscall
embree::ParallelRadixSort<embree::sse2::BVHBuilderMorton::BuildPrim,_unsigned_int>::
tbbRadixIteration0(ParallelRadixSort<embree::sse2::BVHBuilderMorton::BuildPrim,_unsigned_int> *this,
                  uint shift,BuildPrim *src,BuildPrim *dst,size_t threadIndex,size_t threadCount)

{
  uint *puVar1;
  size_t sVar2;
  TyRadixCount *pauVar3;
  ulong uVar4;
  long lVar5;
  size_t i;
  
  sVar2 = this->N;
  for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
    this->radixCount[threadIndex][lVar5] = 0;
  }
  pauVar3 = this->radixCount;
  for (uVar4 = (sVar2 * threadIndex) / threadCount;
      uVar4 < ((threadIndex + 1) * sVar2) / threadCount; uVar4 = uVar4 + 1) {
    puVar1 = pauVar3[threadIndex] + (byte)(src[uVar4].field_0.field_0.code >> ((byte)shift & 0x3f));
    *puVar1 = *puVar1 + 1;
  }
  return;
}

Assistant:

void tbbRadixIteration0(const Key shift, 
                            const Ty* __restrict const src, 
                            Ty* __restrict const dst, 
                            const size_t threadIndex, const size_t threadCount)
    {
      const size_t startID = (threadIndex+0)*N/threadCount;
      const size_t endID   = (threadIndex+1)*N/threadCount;
      
      /* mask to extract some number of bits */
      const Key mask = BUCKETS-1;
      
      /* count how many items go into the buckets */
      for (size_t i=0; i<BUCKETS; i++)
        radixCount[threadIndex][i] = 0;

      /* iterate over src array and count buckets */
      unsigned int * __restrict const count = radixCount[threadIndex];
#if defined(__INTEL_COMPILER)
#pragma nounroll      
#endif
      for (size_t i=startID; i<endID; i++) {
#if defined(__64BIT__)
        const size_t index = ((size_t)(Key)src[i] >> (size_t)shift) & (size_t)mask;
#else
        const Key index = ((Key)src[i] >> shift) & mask;
#endif
        count[index]++;
      }
    }